

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O1

void opj_pi_update_encoding_parameters(opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 p_tile_no)

{
  uint uVar1;
  OPJ_UINT32 p_num_comps;
  uint p_tx0;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint p_tx1;
  uint p_max_prec;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  opj_image_comp_t *poVar13;
  OPJ_UINT32 OVar14;
  uint uVar15;
  opj_tccp_t *poVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint p_dx_min;
  uint uVar22;
  OPJ_UINT32 in_stack_ffffffffffffff10;
  
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x845,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  if (p_image == (opj_image_t *)0x0) {
    __assert_fail("p_image != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x846,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  uVar1 = p_cp->tw;
  if (p_cp->th * uVar1 <= p_tile_no) {
    __assert_fail("p_tile_no < p_cp->tw * p_cp->th",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x847,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  p_max_prec = 0;
  uVar5 = p_cp->tdx;
  uVar8 = (p_tile_no % uVar1) * uVar5 + p_cp->tx0;
  uVar21 = p_cp->tdy;
  p_tx0 = p_image->x0;
  if (p_image->x0 < uVar8) {
    p_tx0 = uVar8;
  }
  p_tx1 = uVar8 + uVar5;
  if (CARRY4(uVar8,uVar5)) {
    p_tx1 = 0xffffffff;
  }
  if (p_image->x1 <= p_tx1) {
    p_tx1 = p_image->x1;
  }
  uVar5 = (p_tile_no / uVar1) * uVar21 + p_cp->ty0;
  uVar1 = p_image->y0;
  if (p_image->y0 < uVar5) {
    uVar1 = uVar5;
  }
  uVar8 = uVar5 + uVar21;
  if (CARRY4(uVar5,uVar21)) {
    uVar8 = 0xffffffff;
  }
  if (p_image->y1 <= uVar8) {
    uVar8 = p_image->y1;
  }
  p_num_comps = p_image->numcomps;
  if (p_num_comps == 0) {
    uVar21 = 0x7fffffff;
    uVar5 = 0;
    p_dx_min = 0x7fffffff;
  }
  else {
    poVar16 = p_cp->tcps[p_tile_no].tccps;
    poVar13 = p_image->comps;
    uVar21 = 0x7fffffff;
    p_max_prec = 0;
    uVar5 = 0;
    p_dx_min = 0x7fffffff;
    OVar14 = 0;
    do {
      uVar19 = (ulong)poVar13->dx;
      if (uVar19 == 0) {
LAB_0012c347:
        __assert_fail("b",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                      ,0xac,"OPJ_UINT32 opj_uint_ceildiv(OPJ_UINT32, OPJ_UINT32)");
      }
      uVar20 = (ulong)poVar13->dy;
      if (uVar20 == 0) goto LAB_0012c347;
      uVar6 = poVar16->numresolutions;
      uVar7 = (ulong)uVar6;
      if (uVar5 < uVar6) {
        uVar5 = uVar6;
      }
      if (uVar7 != 0) {
        lVar17 = 0;
        do {
          uVar6 = uVar6 - 1;
          bVar2 = (byte)uVar6;
          bVar3 = (byte)*(undefined4 *)((long)poVar16->prcw + lVar17);
          uVar11 = poVar13->dx << (bVar2 + bVar3 & 0x1f);
          bVar4 = (byte)*(undefined4 *)((long)poVar16->prch + lVar17);
          uVar15 = poVar13->dy << (bVar2 + bVar4 & 0x1f);
          if (uVar11 <= uVar21) {
            uVar21 = uVar11;
          }
          if (uVar15 <= p_dx_min) {
            p_dx_min = uVar15;
          }
          uVar9 = -1L << (bVar2 & 0x3f) ^ 0xffffffffffffffff;
          uVar18 = (((uVar19 - 1) + (ulong)p_tx1) / uVar19 & 0xffffffff) + uVar9 >> (bVar2 & 0x3f);
          uVar10 = uVar9 + (((uVar8 + uVar20) - 1) / uVar20 & 0xffffffff) >> (bVar2 & 0x3f);
          uVar22 = (uint)((((p_tx0 + uVar19) - 1) / uVar19 & 0xffffffff) + uVar9 >> (bVar2 & 0x3f));
          uVar12 = (uint)((((uVar1 + uVar20) - 1) / uVar20 & 0xffffffff) + uVar9 >> (bVar2 & 0x3f));
          uVar15 = 0 >> (bVar3 & 0x1f);
          uVar11 = ((int)(~(-1L << (bVar3 & 0x3f)) + (uVar18 & 0xffffffff) >> (bVar3 & 0x3f)) -
                    (uVar22 >> (bVar3 & 0x1f)) << (bVar3 & 0x1f)) >> (bVar3 & 0x1f);
          if (uVar22 == (uint)uVar18) {
            uVar11 = uVar15;
          }
          uVar22 = ((int)(~(-1L << (bVar4 & 0x3f)) + (uVar10 & 0xffffffff) >> (bVar4 & 0x3f)) -
                    (uVar12 >> (bVar4 & 0x1f)) << (bVar4 & 0x1f)) >> (bVar4 & 0x1f);
          if (uVar12 == (uint)uVar10) {
            uVar22 = uVar15;
          }
          uVar15 = uVar22 * uVar11;
          if (uVar22 * uVar11 <= p_max_prec) {
            uVar15 = p_max_prec;
          }
          p_max_prec = uVar15;
          lVar17 = lVar17 + 4;
        } while (uVar7 << 2 != lVar17);
      }
      poVar13 = poVar13 + 1;
      poVar16 = poVar16 + 1;
      OVar14 = OVar14 + 1;
    } while (OVar14 != p_num_comps);
  }
  if ((p_cp->tcps[p_tile_no].field_0x1638 & 4) == 0) {
    opj_pi_update_encode_not_poc
              (p_cp,p_num_comps,p_tile_no,p_tx0,p_tx1,uVar1,uVar8,p_max_prec,uVar5,uVar21,p_dx_min);
  }
  else {
    opj_pi_update_encode_poc_and_final
              (p_cp,p_tile_no,p_tx0,p_tx1,uVar1,uVar8,p_max_prec,uVar21,p_dx_min,
               in_stack_ffffffffffffff10);
  }
  return;
}

Assistant:

void opj_pi_update_encoding_parameters(const opj_image_t *p_image,
                                       opj_cp_t *p_cp,
                                       OPJ_UINT32 p_tile_no)
{
    /* encoding parameters to set */
    OPJ_UINT32 l_max_res;
    OPJ_UINT32 l_max_prec;
    OPJ_UINT32 l_tx0, l_tx1, l_ty0, l_ty1;
    OPJ_UINT32 l_dx_min, l_dy_min;

    /* pointers */
    opj_tcp_t *l_tcp = 00;

    /* preconditions */
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(p_tile_no < p_cp->tw * p_cp->th);

    l_tcp = &(p_cp->tcps[p_tile_no]);

    /* get encoding parameters */
    opj_get_encoding_parameters(p_image, p_cp, p_tile_no, &l_tx0, &l_tx1, &l_ty0,
                                &l_ty1, &l_dx_min, &l_dy_min, &l_max_prec, &l_max_res);

    if (l_tcp->POC) {
        opj_pi_update_encode_poc_and_final(p_cp, p_tile_no, l_tx0, l_tx1, l_ty0, l_ty1,
                                           l_max_prec, l_max_res, l_dx_min, l_dy_min);
    } else {
        opj_pi_update_encode_not_poc(p_cp, p_image->numcomps, p_tile_no, l_tx0, l_tx1,
                                     l_ty0, l_ty1, l_max_prec, l_max_res, l_dx_min, l_dy_min);
    }
}